

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<int> * __thiscall
iutest::detail::iuRandomParamsHolder::operator_cast_to_iuIParamGenerator_
          (iuRandomParamsHolder *this)

{
  size_t sVar1;
  uint seed;
  iuIParamGenerator<int> *piVar2;
  size_t local_28;
  iuRandom local_20;
  
  seed = this->m_seed;
  if (seed == 0) {
    seed = GetIndefiniteValue();
  }
  sVar1 = this->m_num;
  iuRandom::iuRandom(&local_20,seed);
  local_28 = sVar1;
  piVar2 = iuValuesParamsGeneratorHolder::operator_cast_to_iuIParamGenerator_
                     ((iuValuesParamsGeneratorHolder *)&local_28);
  return piVar2;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        unsigned int seed = m_seed;
        if( seed == 0 )
        {
            seed = GetIndefiniteValue();
        }
        iuValuesParamsGeneratorHolder< iuTypedRandom<T> > gen( m_num, iuTypedRandom<T>(seed) );
        return gen;
    }